

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O1

int yescrypt_kdf(yescrypt_shared_t *shared,yescrypt_local_t *local,uint8_t *passwd,size_t passwdlen,
                uint8_t *salt,size_t saltlen,uint64_t N,uint32_t r,uint32_t p,uint32_t t,uint32_t g,
                yescrypt_flags_t flags,uint8_t *buf,size_t buflen)

{
  yescrypt_flags_t yVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint8_t *buf_00;
  size_t buflen_00;
  uint8_t *buf_01;
  int iVar5;
  bool bVar6;
  int local_84;
  size_t local_80;
  uint8_t dk [32];
  
  yVar1 = flags & (__YESCRYPT_INIT_SHARED|YESCRYPT_RW);
  uVar4 = (ulong)CONCAT31((int3)(yVar1 >> 8),yVar1 != YESCRYPT_RW);
  buf_01 = passwd;
  local_80 = passwdlen;
  if (((p != 0 && yVar1 == YESCRYPT_RW) && (uVar4 = N / p, 0xff < uVar4)) &&
     (uVar4 = uVar4 * r, 0x1ffff < uVar4)) {
    buf_01 = dk;
    uVar2 = yescrypt_kdf_body(shared,local,passwd,passwdlen,salt,saltlen,N >> 6,r,p,0,
                              flags | __YESCRYPT_PREHASH,buf_01,0x20);
    uVar4 = (ulong)uVar2;
    if (uVar2 != 0) {
      return uVar2;
    }
    local_80 = 0x20;
  }
  local_84 = (int)uVar4;
  uVar4 = (ulong)t;
  iVar5 = -g;
  while( true ) {
    buf_00 = dk;
    if (iVar5 == 0) {
      buf_00 = buf;
    }
    buflen_00 = 0x20;
    if (iVar5 == 0) {
      buflen_00 = buflen;
    }
    iVar3 = yescrypt_kdf_body(shared,local,buf_01,local_80,salt,saltlen,N,r,p,(uint32_t)uVar4,flags,
                              buf_00,buflen_00);
    if (iVar3 == 0) {
      N = N << 2;
      bVar6 = N == 0;
      if (bVar6) {
        local_84 = -1;
        N = 0;
      }
      else {
        uVar4 = uVar4 >> 1;
      }
      bVar6 = !bVar6;
      local_80 = buflen_00;
    }
    else {
      bVar6 = false;
      buf_00 = buf_01;
      local_84 = iVar3;
    }
    if (!bVar6) break;
    iVar5 = iVar5 + 1;
    buf_01 = buf_00;
    if (iVar5 == 1) {
      return 0;
    }
  }
  return local_84;
}

Assistant:

int
yescrypt_kdf(const yescrypt_shared_t * shared, yescrypt_local_t * local,
    const uint8_t * passwd, size_t passwdlen,
    const uint8_t * salt, size_t saltlen,
    uint64_t N, uint32_t r, uint32_t p, uint32_t t, uint32_t g,
    yescrypt_flags_t flags,
    uint8_t * buf, size_t buflen)
{
	uint8_t dk[32];

	if ((flags & (YESCRYPT_RW | __YESCRYPT_INIT_SHARED)) == YESCRYPT_RW &&
	    p >= 1 && N / p >= 0x100 && N / p * r >= 0x20000) {
		int retval = yescrypt_kdf_body(shared, local,
		    passwd, passwdlen, salt, saltlen,
		    N >> 6, r, p, 0, flags | __YESCRYPT_PREHASH,
		    dk, sizeof(dk));
		if (retval)
			return retval;
		passwd = dk;
		passwdlen = sizeof(dk);
	}

	do {
		uint8_t * dkp = g ? dk : buf;
		size_t dklen = g ? sizeof(dk) : buflen;
		int retval = yescrypt_kdf_body(shared, local,
		    passwd, passwdlen, salt, saltlen,
		    N, r, p, t, flags, dkp, dklen);
		if (retval)
			return retval;

		passwd = dkp;
		passwdlen = dklen;

		N <<= 2;
		if (!N)
			return -1;
		t >>= 1;
	} while (g--);

	return 0;
}